

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

char * bc_str_lstrip(char *str)

{
  size_t sVar1;
  size_t sVar2;
  byte *pbVar3;
  
  if (str == (char *)0x0) {
    return (char *)0x0;
  }
  sVar2 = strlen(str);
  pbVar3 = (byte *)str;
  sVar1 = sVar2;
  if (sVar2 != 0) {
    while( true ) {
      if ((4 < *pbVar3 - 9) && (*pbVar3 != 0x20)) {
        return (char *)pbVar3;
      }
      if (sVar1 - 1 == 0) break;
      pbVar3 = pbVar3 + 1;
      sVar1 = sVar1 - 1;
    }
    str = str + sVar2;
  }
  return str;
}

Assistant:

char*
bc_str_lstrip(char *str)
{
    if (str == NULL)
        return NULL;
    int i;
    size_t str_len = strlen(str);
    for (i = 0; i < str_len; i++) {
        if ((str[i] != ' ') && (str[i] != '\t') && (str[i] != '\n') &&
            (str[i] != '\r') && (str[i] != '\t') && (str[i] != '\f') &&
            (str[i] != '\v'))
        {
            str += i;
            break;
        }
        if (i == str_len - 1) {
            str += str_len;
            break;
        }
    }
    return str;
}